

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O1

double __thiscall userinfo_t::GetAimDist(userinfo_t *this)

{
  float fVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = 0.0;
  if ((dmflags2.Value._2_1_ & 0x80) == 0) {
    puVar2 = (undefined8 *)
             ((long)&((this->
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      ).Nodes)->Next +
             (ulong)(((this->
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      ).Size - 1 & 0x1ec) * 0x18));
    do {
      puVar3 = puVar2;
      puVar2 = (undefined8 *)*puVar3;
    } while (*(int *)(puVar3 + 1) != 0x1ec);
    fVar1 = *(float *)(puVar3[2] + 0x28);
    dVar5 = 35.0;
    if (0.0 <= fVar1) {
      dVar5 = (double)fVar1;
    }
    dVar4 = 35.0;
    if (fVar1 <= 35.0) {
      dVar4 = dVar5;
    }
  }
  return dVar4;
}

Assistant:

inline operator int () const { return Value; }